

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<Rect,6ul>::shift_right<Rect*>
          (vector_s<Rect,6ul> *this,Rect *first,Rect *last,size_type n)

{
  Rect *local_48;
  Rect *it;
  pointer insert_ptr;
  size_type i;
  long diff_signed;
  size_type n_local;
  Rect *last_local;
  Rect *first_local;
  vector_s<Rect,_6UL> *this_local;
  
  if (-1 < (long)last - (long)first >> 3) {
    for (insert_ptr = (pointer)0x0; local_48 = last, insert_ptr < n;
        insert_ptr = (pointer)((long)&insert_ptr->width_ + 1)) {
      memset(last + (long)insert_ptr,0,8);
      Rect::Rect(last + (long)insert_ptr);
    }
    while (local_48 != first) {
      local_48 = local_48 + -1;
      local_48[n] = *local_48;
    }
  }
  return;
}

Assistant:

void shift_right(InputIt first, InputIt last, size_type n)
    {
        const long diff_signed = last - first;
        if (diff_signed < 0) {
            return;
        }

        // Make room for elements
        for (size_type i = 0; i < n; ++i) {
            const pointer insert_ptr = last + i;
            new (insert_ptr) value_type(); // Default contruct the extra elements needed. Could perhaps construct when first needed instead!
        }

        for (InputIt it = last; it != first;) {
            --it;
            *(it+n) = std::move(*it);
        }
    }